

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Genetic.cpp
# Opt level: O1

bool Genetic::avaliate_population(void)

{
  _List_node_base *p_Var1;
  double dVar2;
  _List_node_base *p_Var3;
  
  dVar2 = max_weight;
  ticket_max = 0.0;
  p_Var3 = solutions_abi_cxx11_.
           super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (solutions_abi_cxx11_.
      super__List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&solutions_abi_cxx11_) {
    do {
      p_Var1 = (((_List_base<std::pair<Solution_*,_double>,_std::allocator<std::pair<Solution_*,_double>_>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      ticket_max = ticket_max + (dVar2 - (double)p_Var3[1]._M_next[1]._M_prev);
      p_Var3[1]._M_prev = (_List_node_base *)ticket_max;
      p_Var3 = p_Var1;
    } while (p_Var1 != (_List_node_base *)&solutions_abi_cxx11_);
  }
  return (int)ticket_max != 0;
}

Assistant:

bool Genetic::avaliate_population()
{
	double last_weight = 0;
	for (auto it = solutions.begin(); it != solutions.end(); ++it)
	{
		(*it).second = (max_weight - (*it).first->weight) + last_weight;
		last_weight = (*it).second;
	}
	ticket_max = last_weight;
	if (static_cast<int>(ticket_max) == 0)
	{
		return false;
	}
	return true;
}